

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_end_of_early_data(ptls_t *tls,ptls_iovec_t message)

{
  int local_24;
  int ret;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  local_24 = commission_handshake_secret(tls);
  if (local_24 == 0) {
    ptls__key_schedule_update_hash(tls->key_schedule,message.base,message.len);
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    local_24 = 0x202;
  }
  return local_24;
}

Assistant:

static int server_handle_end_of_early_data(ptls_t *tls, ptls_iovec_t message)
{
    int ret;

    if ((ret = commission_handshake_secret(tls)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    return ret;
}